

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus DecodeReturn(MCInst *MI,uint insn,uint64_t Address,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t X;
  DecodeStatus DVar2;
  uint local_44;
  uint local_40;
  uint simm13;
  uint rs2;
  uint isImm;
  uint rs1;
  DecodeStatus status;
  void *Decoder_local;
  uint64_t Address_local;
  uint insn_local;
  MCInst *MI_local;
  
  RegNo = fieldFromInstruction_4(insn,0xe,5);
  uVar1 = fieldFromInstruction_4(insn,0xd,1);
  local_40 = 0;
  local_44 = 0;
  if (uVar1 == 0) {
    local_40 = fieldFromInstruction_4(insn,0,5);
  }
  else {
    X = fieldFromInstruction_4(insn,0,0xd);
    local_44 = SignExtend32(X,0xd);
  }
  MI_local._4_4_ = DecodeIntRegsRegisterClass(MI,RegNo,Address,Decoder);
  if (MI_local._4_4_ == MCDisassembler_Success) {
    if (uVar1 == 0) {
      DVar2 = DecodeIntRegsRegisterClass(MI,local_40,Address,Decoder);
      if (DVar2 != MCDisassembler_Success) {
        return DVar2;
      }
    }
    else {
      MCOperand_CreateImm0(MI,(ulong)local_44);
    }
    MI_local._4_4_ = MCDisassembler_Success;
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus DecodeReturn(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder)
{
	DecodeStatus status;
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	unsigned isImm = fieldFromInstruction_4(insn, 13, 1);
	unsigned rs2 = 0;
	unsigned simm13 = 0;
	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	// Decode RS1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode RS2 | SIMM13.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}